

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::push_back(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
            *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                  *val)

{
  ushort uVar1;
  vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
  *this_00;
  domain_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_t local_40;
  
  uVar1 = (this->m_type).data;
  if ((uVar1 & 0xf) == 0) {
    (this->m_type).data = uVar1 & 0xfff0 | 2;
    this_00 = (vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
               *)operator_new(0x18);
    *(undefined8 *)this_00 = 0;
    *(pointer *)(this_00 + 8) = (pointer)0x0;
    *(pointer *)(this_00 + 0x10) = (pointer)0x0;
    (this->m_value).array = (array_t *)this_00;
  }
  else {
    if ((uVar1 & 0xf) != 2) {
      this_01 = (domain_error *)__cxa_allocate_exception(0x10);
      type_name(&local_40,this);
      std::operator+(&local_60,"cannot use push_back() with ",&local_40);
      std::domain_error::domain_error(this_01,(string *)&local_60);
      __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    this_00 = (vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
               *)(this->m_value).object;
    if (this_00 ==
        (vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
         *)0x0) {
      __assert_fail("m_value.array != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                    ,0x12b0,
                    "void nlohmann::basic_json<>::push_back(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType> &&) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
                   );
    }
  }
  std::
  vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
  ::
  emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>
            (this_00,val);
  *(byte *)&val->m_type = *(byte *)&val->m_type & 0xf0;
  return;
}

Assistant:

void push_back(basic_json&& val)
        {
            // push_back only works for null objects or arrays
            if (not(is_null() or is_array()))
            {
                throw std::domain_error("cannot use push_back() with " + type_name());
            }

            // transform null object into an array
            if (is_null())
            {
                m_type = value_t::array;
                m_value = value_t::array;
            }

            // add element to array (move semantics)
            assert(m_value.array != nullptr);
            m_value.array->push_back(std::move(val));
            // invalidate object
            val.m_type = value_t::null;
        }